

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O2

QSize __thiscall QScrollArea::viewportSizeHint(QScrollArea *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QSize QVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x2f8));
  if (bVar2) {
    if (*(char *)(lVar1 + 0x310) == '\x01') {
      QVar4 = (QSize)(**(code **)(*(long *)*(QWidget **)(lVar1 + 0x300) + 0x70))();
    }
    else {
      QVar4 = QWidget::size(*(QWidget **)(lVar1 + 0x300));
    }
    uVar5 = (ulong)QVar4 >> 0x20;
  }
  else {
    QWidget::fontMetrics((QWidget *)&stack0xffffffffffffffe0);
    iVar3 = QFontMetrics::height();
    QFontMetrics::~QFontMetrics((QFontMetrics *)&stack0xffffffffffffffe0);
    QVar4.wd.m_i = iVar3 * 6;
    QVar4.ht.m_i = 0;
    uVar5 = (ulong)(uint)(iVar3 << 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSize)((ulong)QVar4 & 0xffffffff | uVar5 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QScrollArea::viewportSizeHint() const
{
    Q_D(const QScrollArea);
    if (d->widget) {
        return d->resizable ? d->widget->sizeHint() : d->widget->size();
    }
    const int h = fontMetrics().height();
    return QSize(6 * h, 4 * h);
}